

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O0

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams>::
initShaderSources(DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this)

{
  ostream *poVar1;
  string local_370 [32];
  stringstream local_350 [8];
  stringstream fragShader;
  ostream local_340 [376];
  string local_1c8 [48];
  stringstream local_198 [8];
  stringstream vertShader;
  ostream local_188 [376];
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *local_10;
  DrawTestCase<vkt::Draw::(anonymous_namespace)::DrawIndexedParams> *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"#version 430\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in vec4 in_position;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 1) in vec4 in_color;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 out_color;\n");
  poVar1 = std::operator<<(poVar1,"out gl_PerVertex {\n");
  poVar1 = std::operator<<(poVar1,"    vec4  gl_Position;\n");
  poVar1 = std::operator<<(poVar1,"    float gl_PointSize;\n");
  poVar1 = std::operator<<(poVar1,"};\n");
  poVar1 = std::operator<<(poVar1,"void main() {\n");
  poVar1 = std::operator<<(poVar1,"    gl_PointSize = 1.0;\n");
  poVar1 = std::operator<<(poVar1,"    gl_Position  = in_position;\n");
  poVar1 = std::operator<<(poVar1,"    out_color    = in_color;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_vertShaderSource,local_1c8);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::stringstream::stringstream(local_350);
  poVar1 = std::operator<<(local_340,"#version 430\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) in vec4 in_color;\n");
  poVar1 = std::operator<<(poVar1,"layout(location = 0) out vec4 out_color;\n");
  poVar1 = std::operator<<(poVar1,"void main()\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<(poVar1,"    out_color = in_color;\n");
  std::operator<<(poVar1,"}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_fragShaderSource,local_370);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::stringstream::~stringstream(local_350);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void DrawTestCase<T>::initShaderSources (void)
{
	std::stringstream vertShader;
	vertShader	<< "#version 430\n"
				<< "layout(location = 0) in vec4 in_position;\n"
				<< "layout(location = 1) in vec4 in_color;\n"
				<< "layout(location = 0) out vec4 out_color;\n"

				<< "out gl_PerVertex {\n"
				<< "    vec4  gl_Position;\n"
				<< "    float gl_PointSize;\n"
				<< "};\n"
				<< "void main() {\n"
				<< "    gl_PointSize = 1.0;\n"
				<< "    gl_Position  = in_position;\n"
				<< "    out_color    = in_color;\n"
				<< "}\n";

	m_vertShaderSource = vertShader.str();

	std::stringstream fragShader;
	fragShader	<< "#version 430\n"
				<< "layout(location = 0) in vec4 in_color;\n"
				<< "layout(location = 0) out vec4 out_color;\n"
				<< "void main()\n"
				<< "{\n"
				<< "    out_color = in_color;\n"
				<< "}\n";

	m_fragShaderSource = fragShader.str();
}